

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfArgFormatter<char>::visit_cstring(PrintfArgFormatter<char> *this,char *value)

{
  FormatSpec *pFVar1;
  size_t in_RCX;
  void *__buf;
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *in_RSI;
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *in_RDI;
  
  if (in_RSI == (ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)0x0) {
    pFVar1 = ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::spec(in_RDI);
    if (pFVar1->type_ == 'p') {
      write_null_pointer((PrintfArgFormatter<char> *)in_RSI);
    }
    else {
      ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::write
                (in_RDI,0x1b5a3c,__buf,in_RCX);
    }
  }
  else {
    ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::visit_cstring
              (in_RSI,(char *)in_RDI);
  }
  return;
}

Assistant:

void visit_cstring(const char *value) {
    if (value)
      Base::visit_cstring(value);
    else if (this->spec().type_ == 'p')
      write_null_pointer();
    else
      this->write("(null)");
  }